

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_string.cpp
# Opt level: O3

bool ublib::operator==(Shared_string *lhs,Shared_string *rhs)

{
  element_type *__n;
  element_type *peVar1;
  int iVar2;
  element_type *__s2;
  
  __n = (element_type *)lhs->length_;
  peVar1 = (element_type *)rhs->length_;
  __s2 = peVar1;
  if (peVar1 != (element_type *)0x0) {
    __s2 = (rhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (__n != peVar1) {
    return false;
  }
  if ((__n != (element_type *)0x0) &&
     (iVar2 = bcmp((lhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,__s2,(size_t)__n), iVar2 != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool operator==(Shared_string const& lhs, Shared_string const& rhs) noexcept {
  return std::string_view(lhs) == std::string_view(rhs);
}